

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  Type_Info *this;
  Type_Info *ti;
  element_type *peVar1;
  element_type *peVar2;
  pointer pTVar3;
  type_info *ptVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  pointer unaff_RBP;
  long lVar9;
  bool bVar10;
  Type_Info boxed_type;
  Type_Info boxed_pod_type;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_rhs;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_lhs;
  
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&dynamic_lhs);
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&dynamic_rhs);
  if (dynamic_lhs.
      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    if (dynamic_rhs.
        super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                    *)&boxed_type,
                   &((dynamic_lhs.
                      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_guard).
                    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  );
      ptVar4 = boxed_type.m_type_info;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxed_type.m_bare_type_info);
      if (ptVar4 != (type_info *)0x0) {
        std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                      *)&boxed_type,
                     &((dynamic_rhs.
                        super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_guard).
                      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                    );
        bVar10 = boxed_type.m_type_info == (type_info *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxed_type.m_bare_type_info);
        goto LAB_00333948;
      }
    }
    bVar10 = false;
    goto LAB_00333948;
  }
  bVar10 = true;
  if (dynamic_rhs.
      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) goto LAB_00333948;
  peVar1 = (lhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar2 = (rhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  uVar7 = ((long)(peVar1->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar1->m_types).
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar8 = ((long)(peVar2->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar2->m_types).
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  boxed_type.m_type_info = (type_info *)&Boxed_Value::typeinfo;
  boxed_type.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
  boxed_type.m_flags = 0;
  boxed_pod_type.m_type_info = (type_info *)&Boxed_Number::typeinfo;
  boxed_pod_type.m_bare_type_info = (type_info *)&Boxed_Number::typeinfo;
  boxed_pod_type.m_flags = 0;
  if (uVar7 < uVar8) {
    uVar8 = uVar7;
  }
  uVar7 = 0;
  lVar5 = 0x18;
  do {
    lVar9 = lVar5;
    bVar6 = (byte)unaff_RBP;
    uVar7 = uVar7 + 1;
    if (uVar8 <= uVar7) goto LAB_0033393e;
    pTVar3 = (peVar1->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this = (Type_Info *)((long)&pTVar3->m_type_info + lVar9);
    unaff_RBP = (peVar2->m_types).
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_start;
    ti = (Type_Info *)((long)&unaff_RBP->m_type_info + lVar9);
    bVar10 = Type_Info::bare_equal(this,ti);
  } while ((bVar10) &&
          (lVar5 = lVar9 + 0x18,
          (*(byte *)((long)&pTVar3->m_flags + lVar9) & 1) ==
          (*(byte *)((long)&unaff_RBP->m_flags + lVar9) & 1)));
  bVar10 = Type_Info::bare_equal(this,ti);
  if ((bVar10) &&
     (((*(byte *)((long)&pTVar3->m_flags + lVar9) & 1) != 0 &&
      ((*(byte *)((long)&unaff_RBP->m_flags + lVar9) & 1) == 0)))) {
LAB_00333926:
    bVar6 = 0;
  }
  else {
    bVar10 = Type_Info::bare_equal(this,ti);
    if ((!bVar10) || (bVar6 = 1, (*(byte *)((long)&pTVar3->m_flags + lVar9) & 1) != 0)) {
      bVar10 = Type_Info::bare_equal(this,&boxed_type);
      if (bVar10) goto LAB_00333926;
      bVar10 = Type_Info::bare_equal(ti,&boxed_type);
      bVar6 = 1;
      if (!bVar10) {
        bVar10 = Type_Info::bare_equal(this,&boxed_pod_type);
        if (bVar10) goto LAB_00333926;
        bVar10 = Type_Info::bare_equal(ti,&boxed_pod_type);
        if (!bVar10) {
          bVar6 = Type_Info::operator<(this,ti);
        }
      }
    }
  }
LAB_0033393e:
  bVar10 = (bool)(uVar7 < uVar8 & bVar6);
LAB_00333948:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dynamic_rhs.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dynamic_lhs.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar10;
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs) noexcept {
        auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
        auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

        if (dynamic_lhs && dynamic_rhs) {
          if (dynamic_lhs->get_guard()) {
            return dynamic_rhs->get_guard() ? false : true;
          } else {
            return false;
          }
        }

        if (dynamic_lhs && !dynamic_rhs) {
          return false;
        }

        if (!dynamic_lhs && dynamic_rhs) {
          return true;
        }

        const auto &lhsparamtypes = lhs->get_param_types();
        const auto &rhsparamtypes = rhs->get_param_types();

        const auto lhssize = lhsparamtypes.size();
        const auto rhssize = rhsparamtypes.size();

        const auto boxed_type = user_type<Boxed_Value>();
        const auto boxed_pod_type = user_type<Boxed_Number>();

        for (size_t i = 1; i < lhssize && i < rhssize; ++i) {
          const Type_Info &lt = lhsparamtypes[i];
          const Type_Info &rt = rhsparamtypes[i];

          if (lt.bare_equal(rt) && lt.is_const() == rt.is_const()) {
            continue; // The first two types are essentially the same, next iteration
          }

          // const is after non-const for the same type
          if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const()) {
            return false;
          }

          if (lt.bare_equal(rt) && !lt.is_const()) {
            return true;
          }

          // boxed_values are sorted last
          if (lt.bare_equal(boxed_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_type)) {
            return true;
          }

          if (lt.bare_equal(boxed_pod_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_pod_type)) {
            return true;
          }

          // otherwise, we want to sort by typeid
          return lt < rt;
        }

        return false;
      }